

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void repeat_high_4pixels(__m128i *x,__m128i *row)

{
  __m128i alVar1;
  undefined4 uVar2;
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i alVar5;
  
  alVar1 = *x;
  auVar3 = pshufhw(in_XMM1,(undefined1  [16])alVar1,0);
  alVar4[1]._0_4_ = auVar3._8_4_;
  alVar4[0]._4_4_ = (undefined4)alVar4[1];
  alVar4[0]._0_4_ = (undefined4)alVar4[1];
  alVar4[1]._4_4_ = (undefined4)alVar4[1];
  *row = alVar4;
  auVar3 = pshufhw((undefined1  [16])alVar4,(undefined1  [16])alVar1,0x55);
  alVar5[1]._0_4_ = auVar3._8_4_;
  alVar5[0]._4_4_ = (undefined4)alVar5[1];
  alVar5[0]._0_4_ = (undefined4)alVar5[1];
  alVar5[1]._4_4_ = (undefined4)alVar5[1];
  row[1] = alVar5;
  auVar3 = pshufhw((undefined1  [16])alVar5,(undefined1  [16])alVar1,0xaa);
  uVar2 = auVar3._8_4_;
  *(undefined4 *)row[2] = uVar2;
  *(undefined4 *)((long)row[2] + 4) = uVar2;
  *(undefined4 *)(row[2] + 1) = uVar2;
  *(undefined4 *)((long)row[2] + 0xc) = uVar2;
  auVar3 = pshufhw((undefined1  [16])alVar1,(undefined1  [16])alVar1,0xff);
  uVar2 = auVar3._8_4_;
  *(undefined4 *)row[3] = uVar2;
  *(undefined4 *)((long)row[3] + 4) = uVar2;
  *(undefined4 *)(row[3] + 1) = uVar2;
  *(undefined4 *)((long)row[3] + 0xc) = uVar2;
  return;
}

Assistant:

static inline void repeat_high_4pixels(const __m128i *x, __m128i *row) {
  const __m128i u0 = _mm_shufflehi_epi16(*x, 0);
  const __m128i u1 = _mm_shufflehi_epi16(*x, 0x55);
  const __m128i u2 = _mm_shufflehi_epi16(*x, 0xaa);
  const __m128i u3 = _mm_shufflehi_epi16(*x, 0xff);

  row[0] = _mm_unpackhi_epi64(u0, u0);
  row[1] = _mm_unpackhi_epi64(u1, u1);
  row[2] = _mm_unpackhi_epi64(u2, u2);
  row[3] = _mm_unpackhi_epi64(u3, u3);
}